

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_serializer_boost_po.h
# Opt level: O3

void __thiscall
VW::config::options_serializer_boost_po::serialize<char>
          (options_serializer_boost_po *this,typed_option<char> *typed_option)

{
  element_type *peVar1;
  element_type eVar2;
  undefined8 in_RAX;
  ostream *poVar3;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->field_0x18," --",3);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&this->field_0x18,
                      (typed_option->super_base_option).m_name._M_dataplus._M_p,
                      (typed_option->super_base_option).m_name._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  peVar1 = (typed_option->m_value).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    eVar2 = '\0';
  }
  else {
    eVar2 = *peVar1;
  }
  uStack_18 = CONCAT17(eVar2,(undefined7)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)((long)&uStack_18 + 7),1);
  return;
}

Assistant:

void serialize(typed_option<T> typed_option)
  {
    m_output_stream << " --" << typed_option.m_name << " " << typed_option.value();
  }